

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testInvalidSplitNdWrongNumSplits(void)

{
  RepeatedField<long> *pRVar1;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  uint uVar2;
  uint uVar3;
  Rep *pRVar4;
  ulong uVar5;
  bool bVar6;
  FeatureType *pFVar7;
  ArrayFeatureType *pAVar8;
  long *plVar9;
  FeatureDescription *pFVar10;
  NeuralNetworkLayer *pNVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  Tensor *obj;
  void *pvVar13;
  SplitNDLayerParams *pSVar14;
  ostream *poVar15;
  string *psVar16;
  long lVar17;
  undefined8 *puVar18;
  int iVar19;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar20;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_00;
  uint32_t size;
  uint uVar21;
  Arena *pAVar22;
  Model m;
  Result res1;
  Model MStack_78;
  Result local_48;
  
  CoreML::Specification::Model::Model(&MStack_78,(Arena *)0x0,false);
  if (MStack_78.description_ == (ModelDescription *)0x0) {
    pAVar22 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    MStack_78.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar22);
  }
  pRVar4 = ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001b6bd5:
    pRVar20 = &(MStack_78.description_)->input_;
    pFVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar20->super_RepeatedPtrFieldBase).arena_);
    pvVar13 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar20->super_RepeatedPtrFieldBase,pFVar10);
  }
  else {
    iVar19 = ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar19) goto LAB_001b6bd5;
    ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar19 + 1;
    pvVar13 = pRVar4->elements[iVar19];
  }
  puVar18 = (undefined8 *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
    puVar18 = (undefined8 *)*puVar18;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar13 + 0x10),"input",puVar18);
  if (*(long *)((long)pvVar13 + 0x20) == 0) {
    pAVar22 = (Arena *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar22);
    *(FeatureType **)((long)pvVar13 + 0x20) = pFVar7;
  }
  pFVar7 = *(FeatureType **)((long)pvVar13 + 0x20);
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    uVar5 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar22);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  pAVar8 = (pFVar7->Type_).multiarraytype_;
  pRVar1 = &pAVar8->shape_;
  uVar2 = (pAVar8->shape_).current_size_;
  uVar3 = (pAVar8->shape_).total_size_;
  if (uVar2 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
  }
  plVar9 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar9[uVar2] = 3;
  uVar21 = uVar2 + 1;
  (pAVar8->shape_).current_size_ = uVar21;
  uVar3 = (pAVar8->shape_).total_size_;
  if (uVar21 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
  }
  plVar9 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar9[uVar21] = 5;
  uVar21 = uVar2 + 2;
  (pAVar8->shape_).current_size_ = uVar21;
  uVar3 = (pAVar8->shape_).total_size_;
  if (uVar21 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
  }
  plVar9 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar9[uVar21] = 2;
  pRVar1->current_size_ = uVar2 + 3;
  if (MStack_78.description_ == (ModelDescription *)0x0) {
    pAVar22 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    MStack_78.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar22);
  }
  pRVar4 = ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001b6d41:
    pRVar20 = &(MStack_78.description_)->output_;
    pFVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar20->super_RepeatedPtrFieldBase).arena_);
    pvVar13 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar20->super_RepeatedPtrFieldBase,pFVar10);
  }
  else {
    iVar19 = ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar19) goto LAB_001b6d41;
    ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar19 + 1;
    pvVar13 = pRVar4->elements[iVar19];
  }
  puVar18 = (undefined8 *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
    puVar18 = (undefined8 *)*puVar18;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar13 + 0x10),"output",puVar18);
  if (*(long *)((long)pvVar13 + 0x20) == 0) {
    pAVar22 = (Arena *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar22);
    *(FeatureType **)((long)pvVar13 + 0x20) = pFVar7;
  }
  pFVar7 = *(FeatureType **)((long)pvVar13 + 0x20);
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    uVar5 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar22);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  pAVar8 = (pFVar7->Type_).multiarraytype_;
  pRVar1 = &pAVar8->shape_;
  uVar2 = (pAVar8->shape_).current_size_;
  uVar3 = (pAVar8->shape_).total_size_;
  if (uVar2 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
  }
  plVar9 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar9[uVar2] = 3;
  uVar21 = uVar2 + 1;
  (pAVar8->shape_).current_size_ = uVar21;
  uVar3 = (pAVar8->shape_).total_size_;
  if (uVar21 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
  }
  plVar9 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar9[uVar21] = 5;
  uVar21 = uVar2 + 2;
  (pAVar8->shape_).current_size_ = uVar21;
  uVar3 = (pAVar8->shape_).total_size_;
  if (uVar21 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
  }
  plVar9 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar9[uVar21] = 2;
  pRVar1->current_size_ = uVar2 + 3;
  if (MStack_78._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&MStack_78);
    MStack_78._oneof_case_[0] = 500;
    pAVar22 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    MStack_78.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar22);
  }
  (MStack_78.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  pRVar4 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(MStack_78.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001b6ec6:
    this_00 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
              &(MStack_78.Type_.pipeline_)->models_;
    pNVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_00->super_RepeatedPtrFieldBase).arena_);
    pNVar11 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_00,pNVar11);
  }
  else {
    iVar19 = (MStack_78.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar4->allocated_size <= iVar19) goto LAB_001b6ec6;
    (MStack_78.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar19 + 1;
    pNVar11 = (NeuralNetworkLayer *)pRVar4->elements[iVar19];
  }
  pRVar4 = (pNVar11->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001b6efe:
    pbVar12 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar11->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar13 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar11->input_).super_RepeatedPtrFieldBase,pbVar12);
  }
  else {
    iVar19 = (pNVar11->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar19) goto LAB_001b6efe;
    (pNVar11->input_).super_RepeatedPtrFieldBase.current_size_ = iVar19 + 1;
    pvVar13 = pRVar4->elements[iVar19];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar13,0,*(char **)((long)pvVar13 + 8),0x3cb973);
  this = &pNVar11->output_;
  pRVar4 = (pNVar11->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001b6f52:
    pbVar12 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((this->super_RepeatedPtrFieldBase).arena_);
    pvVar13 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&this->super_RepeatedPtrFieldBase,pbVar12);
  }
  else {
    iVar19 = (pNVar11->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar19) goto LAB_001b6f52;
    (pNVar11->output_).super_RepeatedPtrFieldBase.current_size_ = iVar19 + 1;
    pvVar13 = pRVar4->elements[iVar19];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar13,0,*(char **)((long)pvVar13 + 8),0x3b8d5f);
  pRVar4 = (pNVar11->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001b6f9e:
    pbVar12 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((this->super_RepeatedPtrFieldBase).arena_);
    pvVar13 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&this->super_RepeatedPtrFieldBase,pbVar12);
  }
  else {
    iVar19 = (pNVar11->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar19) goto LAB_001b6f9e;
    (pNVar11->output_).super_RepeatedPtrFieldBase.current_size_ = iVar19 + 1;
    pvVar13 = pRVar4->elements[iVar19];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar13,0,*(char **)((long)pvVar13 + 8),0x3b8d67);
  pRVar4 = (pNVar11->inputtensor_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001b6fea:
    obj = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Tensor>
                    ((pNVar11->inputtensor_).super_RepeatedPtrFieldBase.arena_);
    pvVar13 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar11->inputtensor_).super_RepeatedPtrFieldBase,obj);
  }
  else {
    iVar19 = (pNVar11->inputtensor_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar19) goto LAB_001b6fea;
    (pNVar11->inputtensor_).super_RepeatedPtrFieldBase.current_size_ = iVar19 + 1;
    pvVar13 = pRVar4->elements[iVar19];
  }
  *(undefined4 *)((long)pvVar13 + 0x24) = 3;
  if (pNVar11->_oneof_case_[0] != 0x3cf) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar11);
    pNVar11->_oneof_case_[0] = 0x3cf;
    uVar5 = (pNVar11->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pSVar14 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::SplitNDLayerParams>
                        (pAVar22);
    (pNVar11->layer_).splitnd_ = pSVar14;
  }
  (((pNVar11->layer_).convolution_)->stride_).arena_or_elements_ = (void *)0x5;
  CoreML::validate<(MLModelType)500>(&local_48,&MStack_78);
  bVar6 = CoreML::Result::good(&local_48);
  if (bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x152c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"!((res1).good())",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
  }
  else {
    psVar16 = CoreML::Result::message_abi_cxx11_(&local_48);
    iVar19 = 0;
    lVar17 = std::__cxx11::string::find((char *)psVar16,0x3b8da4,0);
    if (lVar17 != -1) goto LAB_001b71e4;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x152d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar15,"res1.message().find(\"match\") != std::string::npos",0x31);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
  }
  std::ostream::put((char)poVar15);
  iVar19 = 1;
  std::ostream::flush();
LAB_001b71e4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.m_message._M_dataplus._M_p != &local_48.m_message.field_2) {
    operator_delete(local_48.m_message._M_dataplus._M_p,
                    local_48.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&MStack_78);
  return iVar19;
}

Assistant:

int testInvalidSplitNdWrongNumSplits() {

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(2);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input");
    layers->add_output("output1");
    layers->add_output("output2");
    layers->add_inputtensor()->set_rank(3);

    // missing required parameters
    auto *params = layers->mutable_splitnd();
    params->set_numsplits(5);

    Result res1 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res1);
    ML_ASSERT(res1.message().find("match") != std::string::npos);

    return 0;

}